

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.cpp
# Opt level: O3

void set_htelemeters_vectors_Pololu
               (double *angles,double *distances,int nbhtelemeters,timeval tv,int deviceid)

{
  pointer piVar1;
  _Elt_pointer pdVar2;
  _Map_pointer ppdVar3;
  double *m;
  vector<interval,_std::allocator<interval>_> *this;
  double *__args;
  ulong uVar4;
  interval local_48;
  
  if (0 < nbhtelemeters) {
    __args = alpha_mes_pololu + deviceid;
    m = d_mes_pololu + deviceid;
    this = d_all_mes_pololu + deviceid;
    uVar4 = 0;
    do {
      *__args = angles[uVar4];
      *m = distances[uVar4];
      piVar1 = (this->super__Vector_base<interval,_std::allocator<interval>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (d_all_mes_pololu[deviceid].super__Vector_base<interval,_std::allocator<interval>_>._M_impl
          .super__Vector_impl_data._M_finish != piVar1) {
        d_all_mes_pololu[deviceid].super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar1;
      }
      interval::interval(&local_48,m);
      std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
                (this,(vector<interval,_std::allocator<interval>_> *)&local_48);
      pdVar2 = alpha_mes_pololu_vector[deviceid].super__Deque_base<double,_std::allocator<double>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pdVar2 == alpha_mes_pololu_vector[deviceid].
                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                  ((deque<double,std::allocator<double>> *)(alpha_mes_pololu_vector + deviceid),
                   __args);
      }
      else {
        *pdVar2 = *__args;
        alpha_mes_pololu_vector[deviceid].super__Deque_base<double,_std::allocator<double>_>._M_impl
        .super__Deque_impl_data._M_finish._M_cur = pdVar2 + 1;
      }
      pdVar2 = d_mes_pololu_vector[deviceid].super__Deque_base<double,_std::allocator<double>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pdVar2 == d_mes_pololu_vector[deviceid].super__Deque_base<double,_std::allocator<double>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                  ((deque<double,std::allocator<double>> *)(d_mes_pololu_vector + deviceid),m);
      }
      else {
        *pdVar2 = *m;
        d_mes_pololu_vector[deviceid].super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = pdVar2 + 1;
      }
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::push_back(d_all_mes_pololu_vector + deviceid,this);
      local_48.inf = (double)tv.tv_usec * 1e-06 + (double)tv.tv_sec;
      std::deque<double,_std::allocator<double>_>::emplace_back<double>
                (t_pololu_history_vector + deviceid,&local_48.inf);
      std::deque<interval,_std::allocator<interval>_>::push_back
                (xhat_pololu_history_vector + deviceid,(value_type *)&xhat);
      std::deque<interval,_std::allocator<interval>_>::push_back
                (yhat_pololu_history_vector + deviceid,(value_type *)&yhat);
      std::deque<interval,_std::allocator<interval>_>::push_back
                (psihat_pololu_history_vector + deviceid,(value_type *)&psihat);
      std::deque<interval,_std::allocator<interval>_>::push_back
                (vrxhat_pololu_history_vector + deviceid,(value_type *)&vrxhat);
      ppdVar3 = alpha_mes_pololu_vector[deviceid].super__Deque_base<double,_std::allocator<double>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (nbhtelemeters <
          (int)((int)((ulong)((long)alpha_mes_pololu_vector[deviceid].
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_start._M_last -
                             (long)alpha_mes_pololu_vector[deviceid].
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_cur) >> 3) +
                (int)((ulong)((long)alpha_mes_pololu_vector[deviceid].
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_finish._M_cur -
                             (long)alpha_mes_pololu_vector[deviceid].
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_finish._M_first) >> 3) +
               ((((uint)((int)ppdVar3 -
                        *(int *)&alpha_mes_pololu_vector[deviceid].
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (uint)(ppdVar3 == (_Map_pointer)0x0)) * 0x40)) {
        std::deque<double,_std::allocator<double>_>::pop_front(alpha_mes_pololu_vector + deviceid);
        std::deque<double,_std::allocator<double>_>::pop_front(d_mes_pololu_vector + deviceid);
        std::
        deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ::pop_front(d_all_mes_pololu_vector + deviceid);
        std::deque<double,_std::allocator<double>_>::pop_front(t_pololu_history_vector + deviceid);
        std::deque<interval,_std::allocator<interval>_>::pop_front
                  (xhat_pololu_history_vector + deviceid);
        std::deque<interval,_std::allocator<interval>_>::pop_front
                  (yhat_pololu_history_vector + deviceid);
        std::deque<interval,_std::allocator<interval>_>::pop_front
                  (psihat_pololu_history_vector + deviceid);
        std::deque<interval,_std::allocator<interval>_>::pop_front
                  (vrxhat_pololu_history_vector + deviceid);
      }
      uVar4 = uVar4 + 1;
    } while ((uint)nbhtelemeters != uVar4);
  }
  return;
}

Assistant:

void set_htelemeters_vectors_Pololu(double* angles, double* distances, int nbhtelemeters, struct timeval tv, int deviceid)
{
	int i = 0;

	for (i = 0; i < nbhtelemeters; i++)
	{
		alpha_mes_pololu[deviceid] = angles[i];
		d_mes_pololu[deviceid] = distances[i];

		// For compatibility with a Seanet...
		d_all_mes_pololu[deviceid].clear();
		d_all_mes_pololu[deviceid].push_back(d_mes_pololu[deviceid]);

		alpha_mes_pololu_vector[deviceid].push_back(alpha_mes_pololu[deviceid]);
		d_mes_pololu_vector[deviceid].push_back(d_mes_pololu[deviceid]);
		d_all_mes_pololu_vector[deviceid].push_back(d_all_mes_pololu[deviceid]);
		t_pololu_history_vector[deviceid].push_back(tv.tv_sec+0.000001*tv.tv_usec);
		xhat_pololu_history_vector[deviceid].push_back(xhat);
		yhat_pololu_history_vector[deviceid].push_back(yhat);
		psihat_pololu_history_vector[deviceid].push_back(psihat);
		vrxhat_pololu_history_vector[deviceid].push_back(vrxhat);

		if ((int)alpha_mes_pololu_vector[deviceid].size() > nbhtelemeters)
		{
			alpha_mes_pololu_vector[deviceid].pop_front();
			d_mes_pololu_vector[deviceid].pop_front();
			d_all_mes_pololu_vector[deviceid].pop_front();
			t_pololu_history_vector[deviceid].pop_front();
			xhat_pololu_history_vector[deviceid].pop_front();
			yhat_pololu_history_vector[deviceid].pop_front();
			psihat_pololu_history_vector[deviceid].pop_front();
			vrxhat_pololu_history_vector[deviceid].pop_front();
		}
	}
}